

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::finish(search *sch)

{
  task_data *delete_label;
  search *in_RDI;
  size_t i;
  task_data *data;
  v_array<std::pair<unsigned_int,_float>_> *in_stack_ffffffffffffffe0;
  example *in_stack_ffffffffffffffe8;
  ulong uVar1;
  
  delete_label = Search::search::get_task_data<task_data>(in_RDI);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  v_array<std::pair<unsigned_int,_float>_>::delete_v(in_stack_ffffffffffffffe0);
  v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  VW::dealloc_example((_func_void_void_ptr *)delete_label,in_stack_ffffffffffffffe8,
                      (_func_void_void_ptr *)in_stack_ffffffffffffffe0);
  free(delete_label->ex);
  for (uVar1 = 0; uVar1 < 6; uVar1 = uVar1 + 1) {
    v_array<unsigned_int>::delete_v((v_array<unsigned_int> *)in_stack_ffffffffffffffe0);
  }
  if (delete_label != (task_data *)0x0) {
    operator_delete(delete_label);
  }
  return;
}

Assistant:

void finish(Search::search &sch)
{
  task_data *data = sch.get_task_data<task_data>();
  data->valid_actions.delete_v();
  data->valid_action_temp.delete_v();
  data->gold_heads.delete_v();
  data->gold_tags.delete_v();
  data->stack.delete_v();
  data->heads.delete_v();
  data->tags.delete_v();
  data->temp.delete_v();
  data->action_loss.delete_v();
  data->gold_actions.delete_v();
  data->gold_action_losses.delete_v();
  data->gold_action_temp.delete_v();
  VW::dealloc_example(COST_SENSITIVE::cs_label.delete_label, *data->ex);
  free(data->ex);
  for (size_t i = 0; i < 6; i++) data->children[i].delete_v();
  delete data;
}